

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::(anonymous_namespace)::
FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
::
FinalizePlanning<std::unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>const>
          (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           *this,unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 *alloc)

{
  Allocation *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  long lVar1;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *unaff_RBX;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *pFVar2;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *pFVar3;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *unaff_R14;
  byte bVar4;
  long *aplStack_c0 [2];
  long alStack_b0 [2];
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *pFStack_a0;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *pFStack_98;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_80 [112];
  
  bVar4 = 0;
  if (*(long *)this == 0) {
    this_00 = DescriptorPool::Tables::
              CreateFlatAlloc<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        ((alloc->_M_t).
                         super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                         .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                         _M_head_impl,
                         (TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                          *)(this + 0x70));
    unaff_R14 = local_80;
    anon_unknown_23::
    FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::Pointers(this_00);
    pFVar2 = unaff_R14;
    pFVar3 = this;
    for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pFVar3 = *(undefined8 *)pFVar2;
      pFVar2 = pFVar2 + ((ulong)bVar4 * -2 + 1) * 8;
      pFVar3 = pFVar3 + (ulong)bVar4 * -0x10 + 8;
    }
    unaff_RBX = this;
    if (*(long *)this != 0) {
      return;
    }
  }
  else {
    FinalizePlanning<std::unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>const>
              (local_80);
  }
  pFVar2 = local_80;
  FinalizePlanning<std::unique_ptr<google::protobuf::DescriptorPool::Tables,std::default_delete<google::protobuf::DescriptorPool::Tables>>const>
            (pFVar2);
  pFStack_a0 = unaff_RBX;
  pFStack_98 = unaff_R14;
  this_01 = AllocateArray<std::__cxx11::string>(pFVar2,1);
  aplStack_c0[0] = alStack_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_c0,"");
  std::__cxx11::string::operator=((string *)this_01,(string *)aplStack_c0);
  if (aplStack_c0[0] != alStack_b0) {
    operator_delete(aplStack_c0[0],alStack_b0[0] + 1);
  }
  return;
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }